

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf.cxx
# Opt level: O0

void __thiscall xray_re::xr_ogf::~xr_ogf(xr_ogf *this)

{
  xr_ogf *this_local;
  
  (this->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory =
       (_func_int **)&PTR__xr_ogf_0038d088;
  delete_elements<std::vector<xray_re::xr_ogf*,std::allocator<xray_re::xr_ogf*>>>(&this->m_children)
  ;
  delete_elements<std::vector<xray_re::xr_ogf*,std::allocator<xray_re::xr_ogf*>>>(&this->m_lods);
  std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::~vector(&this->m_lods);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->m_children_l);
  std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::~vector(&this->m_children);
  xr_ibuf::~xr_ibuf(&this->m_ib);
  xr_vbuf::~xr_vbuf(&this->m_vb);
  std::__cxx11::string::~string((string *)&this->m_shader);
  std::__cxx11::string::~string((string *)&this->m_texture);
  std::__cxx11::string::~string((string *)&this->m_path);
  xr_object::~xr_object(&this->super_xr_object);
  return;
}

Assistant:

xr_ogf::~xr_ogf()
{
	delete_elements(m_children);
	delete_elements(m_lods);
}